

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

void enet_peer_disconnect(ENetPeer *peer,enet_uint32 data)

{
  undefined1 local_44 [8];
  ENetProtocol command;
  enet_uint32 data_local;
  ENetPeer *peer_local;
  
  if ((((peer->state != ENET_PEER_STATE_DISCONNECTING) &&
       (peer->state != ENET_PEER_STATE_DISCONNECTED)) &&
      (peer->state != ENET_PEER_STATE_ACKNOWLEDGING_DISCONNECT)) &&
     (peer->state != ENET_PEER_STATE_ZOMBIE)) {
    command.connect.connectID = data;
    unique0x10000105 = peer;
    enet_peer_reset_queues(peer);
    local_44[0] = 4;
    local_44[1] = 0xff;
    local_44._4_4_ = htonl(command.connect.connectID);
    if ((stack0xfffffffffffffff0->state == ENET_PEER_STATE_CONNECTED) ||
       (stack0xfffffffffffffff0->state == ENET_PEER_STATE_DISCONNECT_LATER)) {
      local_44[0] = local_44[0] | 0x80;
    }
    else {
      local_44[0] = local_44[0] | 0x40;
    }
    enet_peer_queue_outgoing_command
              (stack0xfffffffffffffff0,(ENetProtocol *)local_44,(ENetPacket *)0x0,0,0);
    if ((stack0xfffffffffffffff0->state == ENET_PEER_STATE_CONNECTED) ||
       (stack0xfffffffffffffff0->state == ENET_PEER_STATE_DISCONNECT_LATER)) {
      enet_peer_on_disconnect(stack0xfffffffffffffff0);
      stack0xfffffffffffffff0->state = ENET_PEER_STATE_DISCONNECTING;
    }
    else {
      enet_host_flush(stack0xfffffffffffffff0->host);
      enet_peer_reset(stack0xfffffffffffffff0);
    }
  }
  return;
}

Assistant:

void enet_peer_disconnect(ENetPeer *peer, enet_uint32 data) {
        ENetProtocol command;

        if (peer->state == ENET_PEER_STATE_DISCONNECTING ||
            peer->state == ENET_PEER_STATE_DISCONNECTED ||
            peer->state == ENET_PEER_STATE_ACKNOWLEDGING_DISCONNECT ||
            peer->state == ENET_PEER_STATE_ZOMBIE
        ) {
            return;
        }

        enet_peer_reset_queues(peer);

        command.header.command   = ENET_PROTOCOL_COMMAND_DISCONNECT;
        command.header.channelID = 0xFF;
        command.disconnect.data  = ENET_HOST_TO_NET_32(data);

        if (peer->state == ENET_PEER_STATE_CONNECTED || peer->state == ENET_PEER_STATE_DISCONNECT_LATER) {
            command.header.command |= ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
        } else {
            command.header.command |= ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED;
        }

        enet_peer_queue_outgoing_command(peer, &command, NULL, 0, 0);

        if (peer->state == ENET_PEER_STATE_CONNECTED || peer->state == ENET_PEER_STATE_DISCONNECT_LATER) {
            enet_peer_on_disconnect(peer);

            peer->state = ENET_PEER_STATE_DISCONNECTING;
        } else {
            enet_host_flush(peer->host);
            enet_peer_reset(peer);
        }
    }